

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * vera::toString<int>(string *__return_storage_ptr__,int *_value,int _width,char _fill)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  undefined8 uVar3;
  ostream *poVar4;
  ostringstream local_198 [8];
  ostringstream out;
  char _fill_local;
  int _width_local;
  int *_value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  uVar3 = std::ostream::operator<<(local_198,std::fixed);
  _Var1 = std::setfill<char>(_fill);
  poVar4 = std::operator<<(uVar3,_Var1._M_c);
  _Var2 = std::setw(_width);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::ostream::operator<<(poVar4,*_value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _width, char _fill) {
    std::ostringstream out;
    out << std::fixed << std::setfill(_fill) << std::setw(_width) << _value;
    return out.str();
}